

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void outputVector<double>(vector<double,_std::allocator<double>_> *vector,string *filename)

{
  pointer pdVar1;
  int i;
  ulong uVar2;
  ofstream stream;
  
  std::ofstream::ofstream(&stream);
  std::ofstream::open((string *)&stream,(_Ios_Openmode)filename);
  for (uVar2 = 0;
      pdVar1 = (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar2 = uVar2 + 1) {
    std::ostream::_M_insert<double>(pdVar1[uVar2]);
    std::endl<char,std::char_traits<char>>((ostream *)&stream);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&stream);
  return;
}

Assistant:

void outputVector(const std::vector<T> &vector, std::string filename){
    std::ofstream stream;
    stream.open(filename, std::ios::out);
    for(int i=0;i<vector.size();i++){
        stream<<vector[i];
        stream<<std::endl;
    }
    stream.close();
}